

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  char cVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ostream *poVar6;
  uint uVar7;
  int iVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  bool bVar13;
  bool bVar14;
  string filename;
  ifstream in;
  int local_290;
  char *local_278;
  long local_270;
  char local_268 [16];
  string local_258;
  allocator local_238 [520];
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_278,argv[1],local_238);
    std::ifstream::ifstream(local_238);
    std::ifstream::open((char *)local_238,(_Ios_Openmode)local_278);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Can\'t open file: ",0x11);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_278,local_270);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      local_290 = 1;
      std::ostream::flush();
    }
    else {
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      uVar3 = readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      uVar4 = readUINT32((ifstream *)local_238);
      uVar7 = uVar4 >> 1 & 1;
      uVar12 = uVar7 ^ 1;
      if ((uVar4 & 4) == 0) {
        uVar12 = 2 - uVar7;
      }
      iVar8 = uVar12 + ((uVar4 & 8) == 0);
      readUINT32((ifstream *)local_238);
      uVar4 = readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      readUINT32((ifstream *)local_238);
      iVar11 = 0x2c;
      do {
        readUINT32((ifstream *)local_238);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
      if (uVar4 != 0) {
        do {
          readUINT32((ifstream *)local_238);
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      if (uVar3 != 0) {
        do {
          readUINT32((ifstream *)local_238);
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      if (iVar8 != 0) {
        iVar11 = iVar8 * 10000;
        do {
          readUINT32((ifstream *)local_238);
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      bVar13 = false;
      local_290 = 0;
      uVar12 = 0;
      do {
        uVar3 = readUINT32((ifstream *)local_238);
        if (uVar3 == 0) {
          bVar14 = true;
        }
        else {
          uVar7 = (int)(short)((short)uVar3 + 0xf) & 0xfffffff0;
          if ((int)uVar7 < 1) {
            uVar4 = 0;
          }
          else {
            uVar4 = 0;
            uVar1 = 1;
            uVar10 = 0;
            do {
              uVar9 = uVar1;
              uVar5 = readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              if (uVar5 >> 0x18 == 1) {
                readUINT32((ifstream *)local_238);
LAB_00102800:
                readUINT32((ifstream *)local_238);
              }
              else if (uVar5 >> 0x18 == 2) goto LAB_00102800;
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              readUINT32((ifstream *)local_238);
              if ((~uVar10 & 0xf) == 0) {
                uVar5 = readUINT32((ifstream *)local_238);
                readUINT32((ifstream *)local_238);
                uVar4 = uVar4 + uVar5;
              }
              uVar1 = uVar9 + 1;
              uVar10 = uVar9;
            } while ((int)(uint)uVar9 < (int)uVar7);
          }
          bVar14 = uVar4 == uVar3;
          if (!bVar14) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Check error!",0xc);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
            std::ostream::put(-0x58);
            local_290 = 1;
            std::ostream::flush();
          }
        }
        if (!bVar14) break;
        bVar13 = 3 < uVar12;
        uVar12 = uVar12 + 1;
      } while (uVar12 != 5);
      if (bVar13) {
        readUINT32((ifstream *)local_238);
        if (iVar8 != 0) {
          iVar11 = 0;
          do {
            for (uVar3 = readUINT32((ifstream *)local_238); uVar3 != 0; uVar3 = uVar3 - 1) {
              readObject((ifstream *)local_238);
            }
            iVar11 = iVar11 + 1;
          } while (iVar11 != iVar8);
        }
        local_290 = 0;
        std::ifstream::close();
      }
    }
    std::ifstream::~ifstream(local_238);
    if (local_278 != local_268) {
      operator_delete(local_278);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_258,*argv,local_238);
    usage(&local_258);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p);
    }
    local_290 = 1;
  }
  return local_290;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        usage(argv[0]);
        return 1;
    }

    std::string filename = argv[1];
    std::ifstream in;

    in.open(filename.c_str(), std::ios_base::binary | std::ios_base::in);
    if (!in.is_open())
    {
        std::cout << "Can't open file: " << filename << std::endl;
        return 1;
    }

    // 4 - version
    readUINT32(in);
    // 16 - name
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    readUINT32(in);
    // 4 - default position
    readUINT32(in);
    // 4 - default elevation
    readUINT32(in);
    // 4 - default orientation
    readUINT32(in);
    // 4 - local vars
    uint32_t localVars = readUINT32(in);
    // 4 - SID
    readUINT32(in);
    // 4 - flags
    uint32_t flags = readUINT32(in);
    // 4 - elevations
    uint32_t elevations = 0;
    if ((flags & 2) == 0) elevations++;
    if ((flags & 4) == 0) elevations++;
    if ((flags & 8) == 0) elevations++;

    // 4 - unknown
    readUINT32(in);
    // 4 - global vars
    uint32_t globalVars = readUINT32(in);
    // 4 - map id
    readUINT32(in);
    // 4 - time
    readUINT32(in);
    // 4*44 - unknown
    for (unsigned i = 0; i != 44; ++i) readUINT32(in);
    // 4 * NUM-GLOBAL-VARS
    for (unsigned i = 0; i != globalVars; ++i) readUINT32(in);
    // 4 * NUM-LOCAL-VARS
    for (unsigned i = 0; i != localVars; ++i) readUINT32(in);
    // 100*100 * 2 * 2 * elevations  - tiles
    for (unsigned i = 0; i != 100*100*elevations; ++i) readUINT32(in);

    // SCRIPTS SECTION
    for (unsigned int i = 0; i < 5; i++)
    {
        uint32_t count = readUINT32(in);
        if (count > 0)
        {
            short loop = count;
            if (count%16 > 0 ) loop += 16 - count%16;

            unsigned int check = 0;
            for (unsigned short j = 0; j < loop; j++)
            {
                {
                    uint32_t PID = readUINT32(in);

                    readUINT32(in); // unknown1

                    switch ((PID & 0xFF000000) >> 24)
                    {
                        case 1:
                            readUINT32(in); //unknown 2
                            readUINT32(in); //unknown 3
                            break;
                        case 2:
                            readUINT32(in); //unknown 2
                            break;
                        default:
                            break;
                    }
                    readUINT32(in); //unknown 4
                    readUINT32(in); // scriptId
                    readUINT32(in); //unknown 5
                    readUINT32(in); //unknown 6
                    readUINT32(in); //unknown 7
                    readUINT32(in); //unknown 8
                    readUINT32(in); //unknown 9
                    readUINT32(in); //unknown 10
                    readUINT32(in); //unknown 11
                    readUINT32(in); //unknown 12
                    readUINT32(in); //unknown 13
                    readUINT32(in); //unknown 14
                    readUINT32(in); //unknown 15
                    readUINT32(in); //unknown 16

                    if (j < count)
                    {
                        //std::cout << "Map script: 0x" << std::hex << script->PID() << std::endl;
                    }

                }
                if ((j % 16) == 15)
                {
                    uint32_t v = readUINT32(in);
                    check += v;

                    readUINT32(in); // skip 4
                }
            }
            if (check != count)
            {
                std::cout << "Check error!" << std::endl;
                return 1;
            }
        }
    }

    // OBJECTS section
    uint32_t objectsTotal = readUINT32(in);

    //std::cout << "Objects: " << objectsTotal << std::endl;

    for (unsigned int i = 0; i != elevations; ++i)
        {
            uint32_t objectsOnElevation = readUINT32(in);
            for (unsigned int j = 0; j != objectsOnElevation; ++j)
            {
                readObject(in);
            }
        }


    in.close();
    return 0;
}